

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

void Gia_ManSuperCollectXor_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  
  while( true ) {
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Gia_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                    ,0x23d,"void Gia_ManSuperCollectXor_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar1 = *(ulong *)pObj;
    uVar3 = (uint)uVar1;
    if ((((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) ||
       (((uint)(uVar1 >> 0x20) & 0x1fffffff) <= (uVar3 & 0x1fffffff))) break;
    pGVar2 = p->pObjs;
    if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) goto LAB_0076f382;
    if ((1 < p->pRefs[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555]) ||
       (100 < p->vSuper->nSize)) break;
    if ((uVar1 & 0x2000000020000000) != 0) {
      __assert_fail("!Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                    ,0x247,"void Gia_ManSuperCollectXor_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManSuperCollectXor_rec(p,pObj + -(ulong)(uVar3 & 0x1fffffff));
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
    iVar4 = (int)((ulong)((long)pObj - (long)pGVar2) >> 2);
    if (-1 < iVar4 * -0x55555555) {
      Vec_IntPush(p->vSuper,iVar4 * 0x55555556);
      return;
    }
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf1,"int Abc_Var2Lit(int, int)");
  }
LAB_0076f382:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManSuperCollectXor_rec( Gia_Man_t * p, Gia_Obj_t * pObj, int fStrict )
{
    assert( !Gia_IsComplement(pObj) );
    if ( !Gia_ObjIsXor(pObj) ||     
        (fStrict && Gia_ObjRefNum(p, pObj) > 1) || 
        Gia_ObjRefNum(p, pObj) > 2 || 
        (Gia_ObjRefNum(p, pObj) == 2 && (Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) == 1 || Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) == 1)) || 
        Vec_IntSize(p->vSuper) > 10000 )
    {
        Vec_IntPush( p->vSuper, Gia_ObjToLit(p, pObj) );
        return;
    }
    assert( !Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) );
    Gia_ManSuperCollectXor_rec( p, Gia_ObjFanin0(pObj), fStrict );
    Gia_ManSuperCollectXor_rec( p, Gia_ObjFanin1(pObj), fStrict );
}